

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedList.c
# Opt level: O1

void * rmlLinkedListRemoveItem(void *self,void *item)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  
  if ((item == (void *)0x0) ||
     ((((*(long *)((long)item + 8) == 0 && (*(long *)((long)item + 0x10) == 0)) && (*self != item))
      && (*(void **)((long)self + 8) != item)))) {
    pvVar3 = (void *)0x0;
  }
  else {
    lVar1 = *(long *)((long)item + 0x10);
    if (lVar1 != 0) {
      *(long *)(lVar1 + 8) = *(long *)((long)item + 8);
    }
    lVar2 = *(long *)((long)item + 8);
    if (lVar2 != 0) {
      *(long *)(lVar2 + 0x10) = lVar1;
    }
    if (*self == item) {
      *(undefined8 *)self = *(undefined8 *)((long)item + 0x10);
    }
    if (*(void **)((long)self + 8) == item) {
      *(long *)((long)self + 8) = lVar2;
    }
    *(long *)((long)self + 0x10) = *(long *)((long)self + 0x10) + -1;
    pvVar3 = *item;
    *(undefined8 *)item = 0;
    *(undefined8 *)((long)item + 8) = 0;
    *(undefined8 *)((long)item + 0x10) = 0;
    free(item);
  }
  return pvVar3;
}

Assistant:

void *rmlLinkedListRemoveItem(void *self, void *item) {
    if (item == NULL) {
        return NULL;
    }

    struct rmlLinkedList *theList = self;
    struct rmlLinkedListItem *theItem = item;
    if (theItem->pre_ == NULL && theItem->next_ == NULL && theItem != theList->head_ && theItem != theList->tail_) {
        return NULL;
    }

    if (theItem->next_ != NULL) {
        theItem->next_->pre_ = theItem->pre_;
    }
    if (theItem->pre_ != NULL) {
        theItem->pre_->next_ = theItem->next_;
    }
    if (item == theList->head_) {
        theList->head_ = theItem->next_;
    }
    if (item == theList->tail_) {
        theList->tail_ = theItem->pre_;
    }
    theList->length_--;

    void *value = theItem->value_;
    rmlLinkedListItemDestroy(item);
    return value;
}